

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input.cpp
# Opt level: O2

int CInput::CJoystick::GetJoystickHatKey(int Hat,int HatValue)

{
  int iVar1;
  
  iVar1 = -1;
  switch(HatValue) {
  case 1:
    return Hat * 8 + 0x1b3;
  case 2:
    return Hat * 8 + 0x1b6;
  case 3:
    return Hat * 8 + 0x1b4;
  case 4:
    return Hat * 8 + 0x1b8;
  case 6:
    iVar1 = Hat * 8 + 0x1b9;
    break;
  case 8:
    return Hat * 8 + 0x1b5;
  case 9:
    return Hat * 8 + 0x1b2;
  case 0xc:
    return Hat * 8 + 0x1b7;
  }
  return iVar1;
}

Assistant:

int CInput::CJoystick::GetJoystickHatKey(int Hat, int HatValue)
{
	switch(HatValue)
	{
		case SDL_HAT_LEFTUP: return KEY_JOY_HAT0_LEFTUP + Hat * NUM_JOYSTICK_BUTTONS_PER_HAT;
		case SDL_HAT_UP: return KEY_JOY_HAT0_UP + Hat * NUM_JOYSTICK_BUTTONS_PER_HAT;
		case SDL_HAT_RIGHTUP: return KEY_JOY_HAT0_RIGHTUP + Hat * NUM_JOYSTICK_BUTTONS_PER_HAT;
		case SDL_HAT_LEFT: return KEY_JOY_HAT0_LEFT + Hat * NUM_JOYSTICK_BUTTONS_PER_HAT;
		case SDL_HAT_RIGHT: return KEY_JOY_HAT0_RIGHT + Hat * NUM_JOYSTICK_BUTTONS_PER_HAT;
		case SDL_HAT_LEFTDOWN: return KEY_JOY_HAT0_LEFTDOWN + Hat * NUM_JOYSTICK_BUTTONS_PER_HAT;
		case SDL_HAT_DOWN: return KEY_JOY_HAT0_DOWN + Hat * NUM_JOYSTICK_BUTTONS_PER_HAT;
		case SDL_HAT_RIGHTDOWN: return KEY_JOY_HAT0_RIGHTDOWN + Hat * NUM_JOYSTICK_BUTTONS_PER_HAT;
	}
	return -1;
}